

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sentencepiece.pb.cc
# Opt level: O0

uint8 * __thiscall
sentencepiece::NBestSentencePieceText::_InternalSerialize
          (NBestSentencePieceText *this,uint8 *target,EpsCopyOutputStream *stream)

{
  uint uVar1;
  uint32 uVar2;
  SentencePieceText *target_00;
  uint8 *puVar3;
  EpsCopyOutputStream *this_00;
  InternalMetadata *this_01;
  uint8 *in_RDX;
  uint8 *in_RSI;
  long in_RDI;
  uint n;
  uint i;
  uint32 cached_has_bits;
  int in_stack_ffffffffffffff0c;
  NBestSentencePieceText *in_stack_ffffffffffffff10;
  EpsCopyOutputStream *in_stack_ffffffffffffff18;
  int size;
  uint uVar4;
  undefined4 uVar5;
  SentencePieceText *this_02;
  
  uVar5 = 0;
  uVar4 = 0;
  uVar1 = _internal_nbests_size((NBestSentencePieceText *)0x4507e5);
  for (; uVar4 < uVar1; uVar4 = uVar4 + 1) {
    target_00 = (SentencePieceText *)
                google::protobuf::io::EpsCopyOutputStream::EnsureSpace
                          (in_stack_ffffffffffffff18,(uint8 *)in_stack_ffffffffffffff10);
    _internal_nbests(in_stack_ffffffffffffff10,in_stack_ffffffffffffff0c);
    this_02 = target_00;
    uVar2 = google::protobuf::internal::WireFormatLite::MakeTag(1,WIRETYPE_LENGTH_DELIMITED);
    puVar3 = google::protobuf::io::CodedOutputStream::WriteVarint32ToArray(uVar2,(uint8 *)target_00)
    ;
    uVar2 = SentencePieceText::GetCachedSize((SentencePieceText *)0x4508c7);
    google::protobuf::io::CodedOutputStream::WriteVarint32ToArray(uVar2,puVar3);
    in_RSI = SentencePieceText::_InternalSerialize
                       (this_02,in_RDX,(EpsCopyOutputStream *)CONCAT44(uVar5,uVar4));
  }
  if (((uint)*(undefined8 *)(in_RDI + 8) & 1) == 1) {
    this_00 = (EpsCopyOutputStream *)(in_RDI + 8);
    if (((uint)this_00->end_ & 1) == 1) {
      google::protobuf::internal::InternalMetadata::
      PtrValue<google::protobuf::internal::InternalMetadata::Container<std::__cxx11::string>>
                ((InternalMetadata *)this_00);
    }
    else {
      google::protobuf::internal::GetEmptyString_abi_cxx11_();
    }
    puVar3 = (uint8 *)std::__cxx11::string::data();
    this_01 = (InternalMetadata *)(in_RDI + 8);
    if (((uint)this_01->ptr_ & 1) == 1) {
      google::protobuf::internal::InternalMetadata::
      PtrValue<google::protobuf::internal::InternalMetadata::Container<std::__cxx11::string>>
                (this_01);
      size = (int)((ulong)this_01 >> 0x20);
    }
    else {
      google::protobuf::internal::GetEmptyString_abi_cxx11_();
      size = (int)((ulong)this_01 >> 0x20);
    }
    std::__cxx11::string::size();
    in_RSI = google::protobuf::io::EpsCopyOutputStream::WriteRaw(this_00,in_RDX,size,puVar3);
  }
  return in_RSI;
}

Assistant:

::PROTOBUF_NAMESPACE_ID::uint8* NBestSentencePieceText::_InternalSerialize(
    ::PROTOBUF_NAMESPACE_ID::uint8* target, ::PROTOBUF_NAMESPACE_ID::io::EpsCopyOutputStream* stream) const {
  // @@protoc_insertion_point(serialize_to_array_start:sentencepiece.NBestSentencePieceText)
  ::PROTOBUF_NAMESPACE_ID::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  // repeated .sentencepiece.SentencePieceText nbests = 1;
  for (unsigned int i = 0,
      n = static_cast<unsigned int>(this->_internal_nbests_size()); i < n; i++) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::
      InternalWriteMessage(1, this->_internal_nbests(i), target, stream);
  }

  if (PROTOBUF_PREDICT_FALSE(_internal_metadata_.have_unknown_fields())) {
    target = stream->WriteRaw(_internal_metadata_.unknown_fields<std::string>(::PROTOBUF_NAMESPACE_ID::internal::GetEmptyString).data(),
        static_cast<int>(_internal_metadata_.unknown_fields<std::string>(::PROTOBUF_NAMESPACE_ID::internal::GetEmptyString).size()), target);
  }
  // @@protoc_insertion_point(serialize_to_array_end:sentencepiece.NBestSentencePieceText)
  return target;
}